

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  string *psVar1;
  uint32_t *puVar2;
  pointer pcVar3;
  bool bVar4;
  SPIRType *ts_6;
  long *plVar5;
  runtime_error *prVar6;
  uint32_t uVar7;
  size_type *psVar8;
  uint uVar9;
  string *in_R9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  char (*ts_7) [2];
  char (*pacVar13) [2];
  SPIRType *pSVar14;
  char *load_op_1;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  SPIRAccessChain *local_380;
  char *load_op;
  string load_expr;
  undefined1 *local_348 [2];
  undefined1 local_338 [20];
  uint local_324;
  string template_expr;
  string base;
  SPIRType scalar_type;
  undefined **local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined8 local_16c;
  undefined1 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  char (*local_128) [2];
  undefined8 local_120;
  undefined8 local_118;
  char local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [32];
  undefined4 local_88;
  undefined8 local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  ts_6 = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(chain->super_IVariant).field_0xc);
  local_160 = local_148;
  local_178 = 0;
  local_180 = &PTR__SPIRType_003f9270;
  local_170 = 0;
  local_158 = 0;
  local_150 = 8;
  pacVar13 = (char (*) [2])local_110;
  local_120 = 0;
  local_118 = 8;
  local_108 = 0;
  local_104 = 0;
  local_100 = 8;
  local_f8 = local_e0;
  local_f0 = 0;
  local_e8 = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_88 = 0;
  local_70 = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_174 = 8;
  local_16c._0_4_ = ts_6->vecsize;
  local_16c._4_4_ = ts_6->columns;
  local_128 = pacVar13;
  if ((ts_6->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    read_access_chain_array(this,lhs,chain);
    goto LAB_0026e4c3;
  }
  local_380 = chain;
  if (*(int *)&(ts_6->super_IVariant).field_0xc == 0xf) {
    read_access_chain_struct(this,lhs,chain);
    goto LAB_0026e4c3;
  }
  if ((ts_6->width != 0x20) && ((this->hlsl_options).enable_16bit_types == false)) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&scalar_type,
               "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
               ,"");
    ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
    *(undefined ***)prVar6 = &PTR__runtime_error_003f8e68;
    __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  base._M_dataplus._M_p = (pointer)&base.field_2;
  pcVar3 = (chain->base)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&base,pcVar3,pcVar3 + (chain->base)._M_string_length);
  ts_7 = (char (*) [2])0x26d859;
  bVar4 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
  if (bVar4) {
    ts_7 = (char (*) [2])0x26d871;
    CompilerGLSL::convert_non_uniform_expression
              (&this->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
  }
  uVar12 = (this->hlsl_options).shader_model;
  load_expr._M_dataplus._M_p = (pointer)&load_expr.field_2;
  load_expr._M_string_length = 0;
  load_expr.field_2._M_local_buf[0] = '\0';
  template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
  template_expr._M_string_length = 0;
  template_expr.field_2._M_local_buf[0] = '\0';
  if (0x3d < uVar12) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&load_op_1,this,ts_6,0);
    join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((string *)&scalar_type,(spirv_cross *)0x35e6b6,(char (*) [2])&load_op_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x368db5,
               pacVar13);
    ts_7 = (char (*) [2])0x26d8f8;
    ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
    if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
      ts_7 = (char (*) [2])0x26d90d;
      operator_delete(scalar_type.super_IVariant._vptr_IVariant);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)load_op_1 != &local_390) {
      ts_7 = (char (*) [2])0x26d920;
      operator_delete(load_op_1);
    }
  }
  local_324 = uVar12;
  if (ts_6->columns == 1) {
    if (chain->row_major_matrix == false) {
      load_op_1 = (char *)0x0;
      switch(ts_6->vecsize) {
      case 1:
        load_op_1 = "Load";
        break;
      case 2:
        load_op_1 = "Load2";
        break;
      case 3:
        load_op_1 = "Load3";
        break;
      case 4:
        load_op_1 = "Load4";
        break;
      default:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&scalar_type,"Unknown vector size.","");
        ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
        *(undefined ***)prVar6 = &PTR__runtime_error_003f8e68;
        __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (0x3d < uVar12) {
        load_op_1 = "Load";
      }
      in_R9 = (string *)0x379f10;
      join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36210b,
                 (char (*) [2])&load_op_1,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x379f10,
                 (char (*) [2])&chain->dynamic_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &chain->static_index,(int *)0x3623fe,ts_7);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
    }
    else {
      pSVar14 = ts_6;
      if (uVar12 < 0x3e) {
        uVar12 = ts_6->vecsize;
        if (1 < uVar12) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type,this,&local_180,0);
          ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
          ::std::__cxx11::string::append((char *)&load_expr);
          goto LAB_0026e283;
        }
      }
      else {
        SPIRType::SPIRType(&scalar_type,ts_6);
        scalar_type.vecsize = 1;
        scalar_type.columns = 1;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_348,this,&scalar_type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&load_op_1,(spirv_cross *)0x35e6b6,(char (*) [2])local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x368db5,
                   pacVar13);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)load_op_1 != &local_390) {
          operator_delete(load_op_1);
        }
        if (local_348[0] != local_338) {
          operator_delete(local_348[0]);
        }
        if (1 < ts_6->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_348,this,ts_6,0);
          plVar5 = (long *)::std::__cxx11::string::append((char *)local_348);
          psVar8 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar8) {
            local_390._M_allocated_capacity = *psVar8;
            local_390._8_8_ = plVar5[3];
            load_op_1 = (char *)&local_390;
          }
          else {
            local_390._M_allocated_capacity = *psVar8;
            load_op_1 = (char *)*plVar5;
          }
          local_398 = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&load_expr,(ulong)load_op_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)load_op_1 != &local_390) {
            operator_delete(load_op_1);
          }
          if (local_348[0] != local_338) {
            operator_delete(local_348[0]);
          }
        }
        scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003f9270;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&scalar_type.member_name_cache._M_h);
        scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
            &scalar_type.member_type_index_redirection.stack_storage) {
          free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
        }
        scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
            scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            ptr != &scalar_type.member_types.stack_storage) {
          free(scalar_type.member_types.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
        }
        scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
            &scalar_type.array_size_literal.stack_storage) {
          free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
        }
        scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
            != &scalar_type.array.stack_storage) {
          free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
        }
LAB_0026e283:
        uVar12 = ts_6->vecsize;
      }
      if (uVar12 != 0) {
        psVar1 = &local_380->dynamic_index;
        uVar12 = 0;
        ts_6 = pSVar14;
        do {
          load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                       local_380->matrix_stride * uVar12 + local_380->static_index);
          in_R9 = psVar1;
          join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    ((string *)&scalar_type,(spirv_cross *)&base,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                     (char (*) [6])&template_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x379f10,
                     (char (*) [2])psVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load_op_1
                     ,(uint *)0x3623fe,(char (*) [2])ts_6);
          ::std::__cxx11::string::_M_append
                    ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
          uVar12 = uVar12 + 1;
          uVar9 = ts_6->vecsize;
          if (uVar12 < uVar9) {
            ::std::__cxx11::string::append((char *)&load_expr);
            uVar9 = ts_6->vecsize;
          }
        } while (uVar12 < uVar9);
        if (1 < uVar9) goto LAB_0026e365;
      }
    }
  }
  else {
    if (chain->row_major_matrix == false) {
      load_op = (char *)0x0;
      switch(ts_6->vecsize) {
      case 1:
        load_op = "Load";
        break;
      case 2:
        load_op = "Load2";
        break;
      case 3:
        load_op = "Load3";
        break;
      case 4:
        load_op = "Load4";
        break;
      default:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&scalar_type.width;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&scalar_type,"Unknown vector size.","");
        ::std::runtime_error::runtime_error(prVar6,(string *)&scalar_type);
        *(undefined ***)prVar6 = &PTR__runtime_error_003f8e68;
        __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar14 = ts_6;
      if (uVar12 < 0x3e) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&scalar_type,this,&local_180,0);
        ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
        if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
          operator_delete(scalar_type.super_IVariant._vptr_IVariant);
        }
      }
      else {
        SPIRType::SPIRType(&scalar_type,ts_6);
        scalar_type.columns = 1;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_348,this,&scalar_type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&load_op_1,(spirv_cross *)0x35e6b6,(char (*) [2])local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x368db5,
                   pacVar13);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)load_op_1 != &local_390) {
          operator_delete(load_op_1);
        }
        if (local_348[0] != local_338) {
          operator_delete(local_348[0]);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&load_op_1,this,ts_6,0);
        ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&load_op_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)load_op_1 != &local_390) {
          operator_delete(load_op_1);
        }
        load_op = "Load";
        scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003f9270;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&scalar_type.member_name_cache._M_h);
        scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
            &scalar_type.member_type_index_redirection.stack_storage) {
          free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
        }
        scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
            scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            ptr != &scalar_type.member_types.stack_storage) {
          free(scalar_type.member_types.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
        }
        scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
            &scalar_type.array_size_literal.stack_storage) {
          free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
        }
        scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
            != &scalar_type.array.stack_storage) {
          free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
        }
      }
      pacVar13 = (char (*) [2])0x26e0a2;
      ::std::__cxx11::string::append((char *)&load_expr);
      puVar2 = &ts_6->columns;
      ts_6 = pSVar14;
      if (*puVar2 != 0) {
        psVar1 = &local_380->dynamic_index;
        uVar12 = 0;
        do {
          load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                       local_380->matrix_stride * uVar12 + local_380->static_index);
          in_R9 = (string *)0x379f10;
          join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    ((string *)&scalar_type,(spirv_cross *)&base,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36210b,
                     (char (*) [2])&load_op,(char **)&template_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x379f10,
                     (char (*) [2])psVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load_op_1
                     ,(uint *)0x3623fe,pacVar13);
          pacVar13 = (char (*) [2])0x26e13a;
          ::std::__cxx11::string::_M_append
                    ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
            pacVar13 = (char (*) [2])0x26e154;
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
          uVar12 = uVar12 + 1;
          uVar9 = ts_6->columns;
          if (uVar12 < uVar9) {
            pacVar13 = (char (*) [2])0x26e172;
            ::std::__cxx11::string::append((char *)&load_expr);
            uVar9 = ts_6->columns;
          }
        } while (uVar12 < uVar9);
      }
      ::std::__cxx11::string::append((char *)&load_expr);
      goto LAB_0026e376;
    }
    pSVar14 = ts_6;
    if (uVar12 < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,&local_180,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&scalar_type,this,ts_6,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
      SPIRType::SPIRType(&scalar_type,ts_6);
      scalar_type.vecsize = 1;
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_348,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((string *)&load_op_1,(spirv_cross *)0x35e6b6,(char (*) [2])local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x368db5,
                 pacVar13);
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_390) {
        operator_delete(load_op_1);
      }
      if (local_348[0] != local_338) {
        operator_delete(local_348[0]);
      }
      scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003f9270;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&scalar_type.member_name_cache._M_h);
      scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
          &scalar_type.member_type_index_redirection.stack_storage) {
        free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
      }
      scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = 0;
      if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          ptr != &scalar_type.member_types.stack_storage) {
        free(scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
             .ptr);
      }
      scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
      if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
          &scalar_type.array_size_literal.stack_storage) {
        free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
      }
      scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
          != &scalar_type.array.stack_storage) {
        free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
      }
    }
    ::std::__cxx11::string::append((char *)&load_expr);
    uVar7 = ts_6->columns;
    if (uVar7 != 0) {
      psVar1 = &local_380->dynamic_index;
      uVar12 = ts_6->vecsize;
      uVar9 = 0;
      do {
        uVar11 = uVar9 + 1;
        bVar4 = uVar12 != 0;
        uVar12 = 0;
        if (bVar4) {
          uVar10 = 0;
          ts_6 = pSVar14;
          do {
            load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                         local_380->matrix_stride * uVar10 +
                                         (ts_6->width >> 3) * uVar9 + local_380->static_index);
            in_R9 = psVar1;
            join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                      ((string *)&scalar_type,(spirv_cross *)&base,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                       (char (*) [6])&template_expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x379f10
                       ,(char (*) [2])psVar1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &load_op_1,(uint *)0x3623fe,(char (*) [2])ts_6);
            ::std::__cxx11::string::_M_append
                      ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
            if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
              operator_delete(scalar_type.super_IVariant._vptr_IVariant);
            }
            uVar10 = uVar10 + 1;
            uVar12 = ts_6->vecsize;
            if ((uVar10 < uVar12) || (uVar11 < ts_6->columns)) {
              ::std::__cxx11::string::append((char *)&load_expr);
              uVar12 = ts_6->vecsize;
            }
          } while (uVar10 < uVar12);
          uVar7 = ts_6->columns;
          pSVar14 = ts_6;
        }
        uVar9 = uVar11;
      } while (uVar11 < uVar7);
    }
LAB_0026e365:
    ::std::__cxx11::string::append((char *)&load_expr);
  }
LAB_0026e376:
  if (local_324 < 0x3e) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])
              (&scalar_type,this,ts_6,&local_180);
    if (scalar_type.super_IVariant._8_8_ != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                ((string *)&load_op_1,(spirv_cross *)&scalar_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x379f10,
                 (char (*) [2])&load_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3623fe,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_390) {
        operator_delete(load_op_1);
      }
    }
    if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.width) {
      operator_delete(scalar_type.super_IVariant._vptr_IVariant);
    }
  }
  if (lhs->_M_string_length == 0) {
    if (expr == (string *)0x0) {
      __assert_fail("expr",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_hlsl.cpp"
                    ,0x121e,
                    "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                   );
    }
    ::std::__cxx11::string::operator=((string *)expr,(string *)&load_expr);
  }
  else {
    CompilerGLSL::
    statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,lhs,(char (*) [4])0x37984e,&load_expr,
               (char (*) [2])0x361554);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)template_expr._M_dataplus._M_p != &template_expr.field_2) {
    operator_delete(template_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)load_expr._M_dataplus._M_p != &load_expr.field_2) {
    operator_delete(load_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base._M_dataplus._M_p != &base.field_2) {
    operator_delete(base._M_dataplus._M_p);
  }
LAB_0026e4c3:
  local_180 = &PTR__SPIRType_003f9270;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_f0 = 0;
  if (local_f8 != local_e0) {
    free(local_f8);
  }
  local_120 = 0;
  if (local_128 != (char (*) [2])local_110) {
    free(local_128);
  }
  local_158 = 0;
  if (local_160 != local_148) {
    free(local_160);
  }
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type;
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	string base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = std::move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}